

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seven-pairs-recognizer.cpp
# Opt level: O0

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::SevenPairsRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,SevenPairsRecognizer *this)

{
  initializer_list<mahjong::Pattern> __l;
  size_type sVar1;
  allocator<mahjong::Pattern> local_2e;
  less<mahjong::Pattern> local_2d;
  Pattern local_2c;
  iterator local_28;
  size_type local_20;
  SevenPairsRecognizer *local_18;
  SevenPairsRecognizer *this_local;
  
  local_18 = this;
  this_local = (SevenPairsRecognizer *)__return_storage_ptr__;
  sVar1 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::size
                    (&this->front_tiles_of_pair);
  if (sVar1 == 7) {
    local_2c = SevenPairs;
    local_28 = &local_2c;
    local_20 = 1;
    std::allocator<mahjong::Pattern>::allocator(&local_2e);
    __l._M_len = local_20;
    __l._M_array = local_28;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
              (__return_storage_ptr__,__l,&local_2d,&local_2e);
    std::allocator<mahjong::Pattern>::~allocator(&local_2e);
  }
  else {
    memset(__return_storage_ptr__,0,0x30);
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

set<Pattern> SevenPairsRecognizer::recognize()
{
	if (7 == front_tiles_of_pair.size())
	{
		return { Pattern::SevenPairs };
	}

	return {};
}